

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O3

int demoFileSize(unqlite_file *pFile,unqlite_int64 *pSize)

{
  int iVar1;
  int iVar2;
  stat sStat;
  stat local_a0;
  
  if (*(int *)&pFile[4].pMethods != 0) {
    iVar1 = demoDirectWrite((DemoFile *)pFile,pFile[3].pMethods,*(int *)&pFile[4].pMethods,
                            (unqlite_int64)pFile[5].pMethods);
    *(undefined4 *)&pFile[4].pMethods = 0;
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = fstat(*(int *)&pFile[2].pMethods,&local_a0);
  iVar2 = -2;
  if (iVar1 == 0) {
    *pSize = local_a0.st_size;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int demoFileSize(unqlite_file *pFile, unqlite_int64 *pSize){
  DemoFile *p = (DemoFile*)pFile;
  int rc;                         /* Return code from fstat() call */
  struct stat sStat;              /* Output of fstat() call */

  /* Flush the contents of the buffer to disk. As with the flush in the
  ** demoRead() method, it would be possible to avoid this and save a write
  ** here and there. But in practice this comes up so infrequently it is
  ** not worth the trouble.
  */
  rc = demoFlushBuffer(p);
  if( rc!=UNQLITE_OK ){
    return rc;
  }

  rc = fstat(p->fd, &sStat);
  if( rc!=0 ) return UNQLITE_IOERR;
  *pSize = sStat.st_size;
  return UNQLITE_OK;
}